

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::NullTypeHandlerBase::SetIsPrototype(NullTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  PropertyTypes values;
  undefined4 *puVar3;
  
  if ((this->super_DynamicTypeHandler).field_0x15 != '\0') {
    return;
  }
  if (NullTypeHandler<true>::defaultInstance[9] != ((this->super_DynamicTypeHandler).flags | 0x20))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0x14d,
                                "(protoTypeHandler->GetFlags() == (GetFlags() | IsPrototypeFlag))",
                                "Why did we change the flags of a NullTypeHandler?");
    if (!bVar2) goto LAB_00c4637e;
    *puVar3 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      (NullTypeHandler<true>::defaultInstance[8] & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0x14e,
                                "(this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) {
LAB_00c4637e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes
            ((DynamicTypeHandler *)NullTypeHandler<true>::defaultInstance,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler
            (instance,(DynamicTypeHandler *)NullTypeHandler<true>::defaultInstance,true);
  return;
}

Assistant:

void NullTypeHandlerBase::SetIsPrototype(DynamicObject* instance)
    {
        if (!this->isPrototype)
        {
            // We don't force a type transition even when ChangeTypeOnProto() == true, because objects with NullTypeHandlers don't
            // have any properties, so there is nothing to invalidate.  Types with NullTypeHandlers also aren't cached in typeWithoutProperty
            // caches, so there will be no fast property add path that could skip prototype cache invalidation.
            NullTypeHandler<true>* protoTypeHandler = NullTypeHandler<true>::GetDefaultInstance();
            AssertMsg(protoTypeHandler->GetFlags() == (GetFlags() | IsPrototypeFlag), "Why did we change the flags of a NullTypeHandler?");
            Assert(this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked());
            protoTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            SetInstanceTypeHandler(instance, protoTypeHandler);
        }
    }